

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O3

void __thiscall notch::pre::OneHotEncoder::countColumnValues(OneHotEncoder *this,Dataset *d)

{
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *this_00;
  _Rb_tree_color *p_Var1;
  pointer piVar2;
  void *__dest;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *this_01;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  pointer pvVar5;
  _Rb_tree_color *p_Var6;
  ulong __n;
  float fVar7;
  int colId_1;
  map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  colMaps;
  set<int,_std::less<int>,_std::allocator<int>_> colVals;
  int colId;
  allocator_type local_109;
  OneHotEncoder *local_108;
  _Rb_tree_color local_fc;
  pointer local_f8;
  pointer piStack_f0;
  pointer local_e8;
  pointer local_d8;
  pointer local_d0;
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_c8;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_98;
  _Rb_tree_color local_68 [2];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar5 = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_d8 = (d->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  local_108 = this;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pvVar5 != local_d8) {
    do {
      __n = pvVar5->_M_size << 2;
      __dest = operator_new(__n);
      local_d0 = pvVar5;
      if (pvVar5->_M_data != (float *)0x0) {
        memcpy(__dest,pvVar5->_M_data,__n);
      }
      p_Var1 = (_Rb_tree_color *)
               (local_108->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (p_Var6 = (_Rb_tree_color *)
                    (local_108->inputColumns).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start; p_Var6 != p_Var1; p_Var6 = p_Var6 + 1) {
        local_68[0] = *p_Var6;
        this_01 = &core::std::
                   map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                 *)&local_c8,(key_type *)local_68)->_M_t;
        fVar7 = roundf(*(float *)((long)__dest + (long)(int)local_68[0] * 4));
        local_98._M_impl._0_4_ = (BADTYPE)fVar7;
        core::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>(this_01,(int *)&local_98);
      }
      operator_delete(__dest);
      pvVar5 = local_d0 + 1;
    } while (pvVar5 != local_d8);
  }
  local_108->nExtraCols = 0;
  this_00 = &local_108->columnValues;
  core::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&this_00->_M_t);
  if ((_Rb_tree_header *)local_c8._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_c8._M_impl.super__Rb_tree_header) {
    p_Var4 = local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_68[0] = p_Var4[1]._M_color;
      core::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _Rb_tree(&local_60,
               (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               &p_Var4[1]._M_parent);
      local_fc = local_68[0];
      core::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _Rb_tree(&local_98,&local_60);
      std::vector<int,std::allocator<int>>::vector<std::_Rb_tree_const_iterator<int>,void>
                ((vector<int,std::allocator<int>> *)&local_f8,
                 (_Rb_tree_const_iterator<int>)
                 local_98._M_impl.super__Rb_tree_header._M_header._M_left,
                 (_Rb_tree_const_iterator<int>)&local_98._M_impl.super__Rb_tree_header,&local_109);
      pmVar3 = core::std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](this_00,(key_type *)&local_fc);
      piVar2 = (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start = local_f8;
      (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piStack_f0;
      (pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = local_e8;
      local_f8 = (pointer)0x0;
      piStack_f0 = (pointer)0x0;
      local_e8 = (pointer)0x0;
      if (piVar2 != (pointer)0x0) {
        operator_delete(piVar2);
        if (local_f8 != (pointer)0x0) {
          operator_delete(local_f8);
        }
      }
      pmVar3 = core::std::
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               ::operator[](this_00,(key_type *)&local_fc);
      local_108->nExtraCols =
           (local_108->nExtraCols +
           ((long)(pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pmVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start >> 2)) - 1;
      core::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      ~_Rb_tree(&local_98);
      core::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      ~_Rb_tree(&local_60);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &local_c8._M_impl.super__Rb_tree_header);
  }
  core::std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  return;
}

Assistant:

void countColumnValues(const Dataset &d) {
        std::map<int, std::set<int>> colMaps; // columnIndex -> {categories}
        for (Array a : d) {
            for (int colId : inputColumns) {
                colMaps[colId].insert(int(std::round(a[colId])));
            }
        }
        nExtraCols = 0;
        columnValues.clear();
        for (auto col : colMaps) {
            auto colId = col.first;
            auto colVals = col.second;
            columnValues[colId] = std::vector<int>(colVals.begin(), colVals.end());
            nExtraCols += columnValues[colId].size() - 1;
        }
    }